

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O2

void __thiscall t_program::add_include(t_program *this,string *path,string *include_site)

{
  t_program *this_00;
  long lVar1;
  t_program *program;
  string include_prefix;
  string local_80;
  string local_60;
  string local_40 [32];
  
  this_00 = (t_program *)operator_new(0x238);
  std::__cxx11::string::string((string *)&local_60,(string *)path);
  t_program(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  include_prefix._M_dataplus._M_p = (pointer)&include_prefix.field_2;
  include_prefix._M_string_length = 0;
  include_prefix.field_2._M_local_buf[0] = '\0';
  program = this_00;
  lVar1 = std::__cxx11::string::rfind((char *)include_site,0x2cc44d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)include_site);
    std::__cxx11::string::operator=((string *)&include_prefix,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string((string *)&local_80,(string *)&include_prefix);
  set_include_prefix(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::push_back(&this->includes_,&program);
  std::__cxx11::string::~string((string *)&include_prefix);
  return;
}

Assistant:

void add_include(std::string path, std::string include_site) {
    t_program* program = new t_program(path);

    // include prefix for this program is the site at which it was included
    // (minus the filename)
    std::string include_prefix;
    std::string::size_type last_slash = std::string::npos;
    if ((last_slash = include_site.rfind("/")) != std::string::npos) {
      include_prefix = include_site.substr(0, last_slash);
    }

    program->set_include_prefix(include_prefix);
    includes_.push_back(program);
  }